

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t assertion_memory_filled_with
                  (char *file,wchar_t line,void *_v1,char *vd,size_t l,char *ld,char b,char *bd,
                  void *extra)

{
  size_t sVar1;
  ulong uVar2;
  
  msg = nextmsg;
  assertions = assertions + L'\x01';
  nextmsg = (char *)0x0;
  uVar2 = 0;
  for (sVar1 = 0; l != sVar1; sVar1 = sVar1 + 1) {
    uVar2 = uVar2 + (*(char *)((long)_v1 + sVar1) == b);
  }
  if (uVar2 != l) {
    failure_start(file,line,"%s (size %d) not filled with %s",vd,l,bd);
    logprintf("   Only %d bytes were correct\n",uVar2 & 0xffffffff);
    failure_finish(extra);
  }
  return (uint)(uVar2 == l);
}

Assistant:

int
assertion_memory_filled_with(const char *file, int line,
    const void *_v1, const char *vd,
    size_t l, const char *ld,
    char b, const char *bd, void *extra)
{
	const char *v1 = (const char *)_v1;
	size_t c = 0;
	size_t i;
	(void)ld; /* UNUSED */

	assertion_count(file, line);

	for (i = 0; i < l; ++i) {
		if (v1[i] == b) {
			++c;
		}
	}
	if (c == l)
		return (1);

	failure_start(file, line, "%s (size %d) not filled with %s", vd, (int)l, bd);
	logprintf("   Only %d bytes were correct\n", (int)c);
	failure_finish(extra);
	return (0);
}